

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int check_assoc_priority(PNode *pn0,PNode *pn1,PNode *pn2)

{
  int iVar1;
  PNode *pn2_local;
  PNode *pn1_local;
  PNode *pn0_local;
  
  if (((pn0->op_assoc & 0x10) == ASSOC_NONE) && ((pn0->op_assoc & 8) == ASSOC_NONE)) {
    if ((((pn1->op_assoc & 0x10) != ASSOC_NONE) || ((pn1->op_assoc & 8) != ASSOC_NONE)) &&
       ((pn0->assoc != ASSOC_NONE &&
        (iVar1 = check_child(pn1->op_priority,pn1->op_assoc,pn0->priority,pn0->assoc,0,1),
        iVar1 == 0)))) {
      return -1;
    }
  }
  else {
    if (pn1->op_assoc == ASSOC_NONE) {
      if (((pn2 != (PNode *)0x0) && (pn2->op_assoc != ASSOC_NONE)) &&
         (iVar1 = check_child(pn2->op_priority,pn2->op_assoc,pn0->op_priority,pn0->op_assoc,0,1),
         iVar1 == 0)) {
        return -1;
      }
    }
    else {
      iVar1 = check_child(pn1->op_priority,pn1->op_assoc,pn0->op_priority,pn0->op_assoc,0,1);
      if (iVar1 == 0) {
        return -1;
      }
    }
    if ((pn1->assoc != ASSOC_NONE) &&
       (iVar1 = check_child(pn0->op_priority,pn0->op_assoc,pn1->priority,pn1->assoc,1,0), iVar1 == 0
       )) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int check_assoc_priority(PNode *pn0, PNode *pn1, PNode *pn2) {
  if (!IS_UNARY_BINARY_ASSOC(pn0->op_assoc)) {
    if (IS_UNARY_BINARY_ASSOC(pn1->op_assoc)) { /* second token is operator */
      /* check expression pn0 (child of pn1) */
      if (pn0->assoc) {
        if (!check_child(pn1->op_priority, pn1->op_assoc, pn0->priority, pn0->assoc, 0, 1)) return -1;
      }
    }
  } else { /* pn0 is an operator */
    if (pn1->op_assoc) {
      /* check pn0 (child of operator pn1) */
      if (!check_child(pn1->op_priority, pn1->op_assoc, pn0->op_priority, pn0->op_assoc, 0, 1)) return -1;
    } else if (pn2) {
      /* check pn0 (child of operator pn2) */
      if (pn2->op_assoc && !check_child(pn2->op_priority, pn2->op_assoc, pn0->op_priority, pn0->op_assoc, 0, 1))
        return -1;
    }
    /* check expression pn1 (child of pn0)  */
    if (pn1->assoc) {
      if (!check_child(pn0->op_priority, pn0->op_assoc, pn1->priority, pn1->assoc, 1, 0)) return -1;
    }
  }
  return 0;
}